

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

CoreObject * helics::getCoreObject(HelicsCore core,HelicsError *err)

{
  HelicsError *in_RSI;
  CoreObject *in_RDI;
  CoreObject *coreObj;
  CoreObject *local_8;
  
  if ((in_RSI == (HelicsError *)0x0) || (in_RSI->error_code == 0)) {
    if (in_RDI == (CoreObject *)0x0) {
      assignError(in_RSI,-3,"core object is not valid");
      local_8 = (CoreObject *)0x0;
    }
    else {
      local_8 = in_RDI;
      if (in_RDI->valid != 0x378424ec) {
        assignError(in_RSI,-3,"core object is not valid");
        local_8 = (CoreObject *)0x0;
      }
    }
  }
  else {
    local_8 = (CoreObject *)0x0;
  }
  return local_8;
}

Assistant:

CoreObject* getCoreObject(HelicsCore core, HelicsError* err) noexcept
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (core == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidCoreString);
        return nullptr;
    }
    auto* coreObj = reinterpret_cast<helics::CoreObject*>(core);
    if (coreObj->valid == gCoreValidationIdentifier) {
        return coreObj;
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidCoreString);
    return nullptr;
}